

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O0

void __thiscall coins_tests::ccoins_serialization::test_method(ccoins_serialization *this)

{
  Span<const_unsigned_char> vch;
  Span<const_unsigned_char> vch_00;
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  Span<const_std::byte> sp_01;
  Span<const_std::byte> sp_02;
  Span<const_std::byte> s;
  Span<const_std::byte> sp_03;
  Span<const_unsigned_char> s_00;
  Span<const_unsigned_char> s_01;
  Span<const_unsigned_char> s_02;
  Span<const_unsigned_char> s_03;
  bool bVar1;
  array<std::byte,_3UL> aVar2;
  array<std::byte,_7UL> aVar3;
  undefined1 extraout_var;
  long in_FS_OFFSET;
  failure *anon_var_0_1;
  failure *anon_var_0;
  DataStream ss5;
  uint64_t x;
  DataStream tmp;
  DataStream ss4;
  DataStream ss3;
  DataStream ss2;
  DataStream ss1;
  Coin cc5;
  Coin cc4;
  Coin cc3;
  Coin cc2;
  Coin cc1;
  char *in_stack_fffffffffffff408;
  char *in_stack_fffffffffffff410;
  char *in_stack_fffffffffffff418;
  DataStream *in_stack_fffffffffffff420;
  size_t in_stack_fffffffffffff428;
  undefined7 in_stack_fffffffffffff430;
  undefined1 in_stack_fffffffffffff437;
  lazy_ostream *in_stack_fffffffffffff438;
  const_string *in_stack_fffffffffffff440;
  const_string *file;
  unit_test_log_t *in_stack_fffffffffffff448;
  undefined4 in_stack_fffffffffffff490;
  undefined4 in_stack_fffffffffffff494;
  size_t in_stack_fffffffffffff498;
  const_string local_a00;
  lazy_ostream local_9f0 [2];
  assertion_result local_9d0 [5];
  undefined1 local_958 [16];
  undefined1 local_948 [64];
  unsigned_long *local_908;
  undefined8 local_900;
  undefined8 local_8f8;
  undefined8 uStack_8f0;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  const_string local_8d8;
  lazy_ostream local_8c8 [2];
  assertion_result local_8a8 [4];
  DataStream local_840 [2];
  DataStream local_7e4 [2];
  DataStream local_790 [2];
  DataStream local_735 [5];
  undefined1 local_680 [16];
  undefined1 local_670 [68];
  DataStream local_62c [2];
  DataStream local_5d8 [2];
  DataStream local_57d [5];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [64];
  DataStream local_478 [2];
  DataStream local_420 [2];
  DataStream local_3c5 [4];
  undefined4 local_33d;
  undefined2 local_339;
  byte local_337;
  undefined2 local_336;
  byte local_334;
  undefined2 local_333;
  byte local_331;
  undefined1 local_300 [80];
  undefined1 local_2b0 [40];
  uint local_288;
  DataStream local_1d0;
  undefined1 local_1b0 [32];
  undefined1 local_190 [40];
  uint local_168;
  DataStream local_98;
  undefined1 local_78 [32];
  undefined1 local_58 [40];
  uint local_30;
  long local_8;
  unit_test_log_t *this_00;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<53UL>___151,_242,_60,_131,_88,_0,_129,_97,_21,_148,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,26ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff418,
             (array<std::byte,_26UL> *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  sp.m_data._7_1_ = in_stack_fffffffffffff437;
  sp.m_data._0_7_ = in_stack_fffffffffffff430;
  sp.m_size = (size_t)in_stack_fffffffffffff438;
  DataStream::DataStream(in_stack_fffffffffffff420,sp);
  Coin::Coin((Coin *)in_stack_fffffffffffff408);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffff418,(Coin *)in_stack_fffffffffffff410);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_3c5[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._1_4_ = local_30 & 1;
    local_3c5[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    in_stack_fffffffffffff418 = "false";
    in_stack_fffffffffffff410 = (char *)local_3c5;
    in_stack_fffffffffffff408 = "cc1.fCoinBase";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,bool>
              ((undefined1 *)
               ((long)&local_3c5[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 5),
               (undefined1 *)
               ((long)&local_3c5[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 5),0x207,1,2,
               (undefined1 *)
               ((long)&local_3c5[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_420[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = local_30 >> 1;
    local_420[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x31cde;
    in_stack_fffffffffffff418 = "203998U";
    in_stack_fffffffffffff410 = (char *)local_420;
    in_stack_fffffffffffff408 = "cc1.nHeight";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_420[0].m_read_pos,
               &local_420[0].vch.
                super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish,0x208,1,2,
               (undefined1 *)
               ((long)&local_420[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_478[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0xdf8475800;
    in_stack_fffffffffffff418 = "CAmount{60000000000}";
    in_stack_fffffffffffff410 = (char *)local_478;
    in_stack_fffffffffffff408 = "cc1.out.nValue";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_478[0].m_read_pos,
               &local_478[0].vch.
                super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish,0x209,1,2,local_58);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff418,
               (CScript *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    s_00.m_data._4_4_ = in_stack_fffffffffffff494;
    s_00.m_data._0_4_ = in_stack_fffffffffffff490;
    s_00.m_size = in_stack_fffffffffffff498;
    HexStr_abi_cxx11_(s_00);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___129,_97,_21,_148,_78,_7,_127,_231,_200,_3,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff418,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    vch.m_size = in_stack_fffffffffffff428;
    vch.m_data = (uchar *)in_stack_fffffffffffff420;
    uint160::uint160((uint160 *)in_stack_fffffffffffff408,vch);
    PKHash::PKHash((PKHash *)in_stack_fffffffffffff408,(uint160 *)0x50a7fc);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<PKHash,void,void,PKHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff418,(PKHash *)in_stack_fffffffffffff410);
    GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff408);
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff418,
               (CScript *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    s_01.m_data._4_4_ = in_stack_fffffffffffff494;
    s_01.m_data._0_4_ = in_stack_fffffffffffff490;
    s_01.m_size = in_stack_fffffffffffff498;
    HexStr_abi_cxx11_(s_01);
    in_stack_fffffffffffff418 =
         "HexStr(GetScriptForDestination(PKHash(uint160(\"816115944e077fe7c803cfa57f29b36bf87c1d35\"_hex_u8))))"
    ;
    in_stack_fffffffffffff410 = (char *)&local_98;
    in_stack_fffffffffffff408 = "HexStr(cc1.out.scriptPubKey)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_4b8,local_4c8,0x20a,1,2,local_78);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    CScript::~CScript((CScript *)in_stack_fffffffffffff408);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  util::hex_literals::
  operator___hex<util::hex_literals::detail::Hex<55UL>___141,_223,_119,_187,_209,_35,_0,_140,_152,_143,_______>
            ();
  Span<std::byte_const>::Span<std::array<std::byte,27ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff418,
             (array<std::byte,_27UL> *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  sp_00.m_data._7_1_ = in_stack_fffffffffffff437;
  sp_00.m_data._0_7_ = in_stack_fffffffffffff430;
  sp_00.m_size = (size_t)in_stack_fffffffffffff438;
  DataStream::DataStream(in_stack_fffffffffffff420,sp_00);
  Coin::Coin((Coin *)in_stack_fffffffffffff408);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffff418,(Coin *)in_stack_fffffffffffff410);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_57d[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._1_4_ = local_168 & 1;
    local_57d[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 1;
    in_stack_fffffffffffff418 = "true";
    in_stack_fffffffffffff410 = (char *)local_57d;
    in_stack_fffffffffffff408 = "cc2.fCoinBase";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,bool>
              ((undefined1 *)
               ((long)&local_57d[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 5),
               (undefined1 *)
               ((long)&local_57d[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 5),0x210,1,2,
               (undefined1 *)
               ((long)&local_57d[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_5d8[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = local_168 >> 1;
    local_5d8[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x1d83b;
    in_stack_fffffffffffff418 = "120891U";
    in_stack_fffffffffffff410 = (char *)local_5d8;
    in_stack_fffffffffffff408 = "cc2.nHeight";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_5d8[0].m_read_pos,
               &local_5d8[0].vch.
                super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish,0x211,1,2,
               (undefined1 *)
               ((long)&local_5d8[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_62c[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0x1af3d;
    in_stack_fffffffffffff418 = "110397";
    in_stack_fffffffffffff410 = (char *)local_62c;
    in_stack_fffffffffffff408 = "cc2.out.nValue";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              ((undefined1 *)
               ((long)&local_62c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_62c[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x212,1,2,local_190);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff418,
               (CScript *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    s_02.m_data._4_4_ = in_stack_fffffffffffff494;
    s_02.m_data._0_4_ = in_stack_fffffffffffff490;
    s_02.m_size = in_stack_fffffffffffff498;
    HexStr_abi_cxx11_(s_02);
    util::hex_literals::
    operator___hex_u8<util::hex_literals::detail::Hex<41UL>___140,_152,_143,_26,_74,_77,_226,_22,_30,_15,_______>
              ();
    Span<unsigned_char_const>::Span<std::array<unsigned_char,20ul>>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff418,
               (array<unsigned_char,_20UL> *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    vch_00.m_size = in_stack_fffffffffffff428;
    vch_00.m_data = (uchar *)in_stack_fffffffffffff420;
    uint160::uint160((uint160 *)in_stack_fffffffffffff408,vch_00);
    PKHash::PKHash((PKHash *)in_stack_fffffffffffff408,(uint160 *)0x50ae7e);
    std::
    variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
    ::variant<PKHash,void,void,PKHash,void>
              ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff418,(PKHash *)in_stack_fffffffffffff410);
    GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff408);
    Span<const_unsigned_char>::Span<CScript>
              ((Span<const_unsigned_char> *)in_stack_fffffffffffff418,
               (CScript *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    s_03.m_data._4_4_ = in_stack_fffffffffffff494;
    s_03.m_data._0_4_ = in_stack_fffffffffffff490;
    s_03.m_size = in_stack_fffffffffffff498;
    HexStr_abi_cxx11_(s_03);
    in_stack_fffffffffffff418 =
         "HexStr(GetScriptForDestination(PKHash(uint160(\"8c988f1a4a4de2161e0f50aac7f17e7f9555caa4\"_hex_u8))))"
    ;
    in_stack_fffffffffffff410 = (char *)&local_1d0;
    in_stack_fffffffffffff408 = "HexStr(cc2.out.scriptPubKey)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_670,local_680,0x213,1,2,local_1b0);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    CScript::~CScript((CScript *)in_stack_fffffffffffff408);
    std::
    variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
    ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                *)in_stack_fffffffffffff408);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  aVar2 = util::hex_literals::operator___hex<util::hex_literals::detail::Hex<7UL>___0,_0,_6___>();
  local_333 = aVar2._M_elems._0_2_;
  local_331 = aVar2._M_elems[2];
  Span<std::byte_const>::Span<std::array<std::byte,3ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff418,
             (array<std::byte,_3UL> *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  sp_01.m_data._7_1_ = in_stack_fffffffffffff437;
  sp_01.m_data._0_7_ = in_stack_fffffffffffff430;
  sp_01.m_size = (size_t)in_stack_fffffffffffff438;
  DataStream::DataStream(in_stack_fffffffffffff420,sp_01);
  Coin::Coin((Coin *)in_stack_fffffffffffff408);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffff418,(Coin *)in_stack_fffffffffffff410);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_735[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._1_4_ = local_288 & 1;
    local_735[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    in_stack_fffffffffffff418 = "false";
    in_stack_fffffffffffff410 = (char *)local_735;
    in_stack_fffffffffffff408 = "cc3.fCoinBase";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,bool>
              ((undefined1 *)
               ((long)&local_735[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 5),
               (undefined1 *)
               ((long)&local_735[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 5),0x219,1,2,
               (undefined1 *)
               ((long)&local_735[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 1));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_790[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ = local_288 >> 1;
    local_790[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    in_stack_fffffffffffff418 = "0U";
    in_stack_fffffffffffff410 = (char *)local_790;
    in_stack_fffffffffffff408 = "cc3.nHeight";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_790[0].m_read_pos,
               &local_790[0].vch.
                super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish,0x21a,1,2,
               (undefined1 *)
               ((long)&local_790[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_7e4[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    in_stack_fffffffffffff418 = "0";
    in_stack_fffffffffffff410 = (char *)local_7e4;
    in_stack_fffffffffffff408 = "cc3.out.nValue";
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,int>
              ((undefined1 *)
               ((long)&local_7e4[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),
               (undefined1 *)
               ((long)&local_7e4[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4),0x21b,1,2,local_2b0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    local_840[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._4_4_ =
         prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                   ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)in_stack_fffffffffffff418);
    local_840[0].vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start._0_4_ = 0;
    in_stack_fffffffffffff418 = "0U";
    in_stack_fffffffffffff410 = (char *)local_840;
    in_stack_fffffffffffff408 = "cc3.out.scriptPubKey.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (&local_840[0].m_read_pos,
               &local_840[0].vch.
                super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish,0x21c,1,2,
               (undefined1 *)
               ((long)&local_840[0].vch.
                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                       super__Vector_impl_data._M_start + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  aVar2 = util::hex_literals::operator___hex<util::hex_literals::detail::Hex<7UL>___0,_0,_7___>();
  local_336 = aVar2._M_elems._0_2_;
  local_334 = aVar2._M_elems[2];
  Span<std::byte_const>::Span<std::array<std::byte,3ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff418,
             (array<std::byte,_3UL> *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  sp_02.m_data._7_1_ = in_stack_fffffffffffff437;
  sp_02.m_data._0_7_ = in_stack_fffffffffffff430;
  sp_02.m_size = (size_t)in_stack_fffffffffffff438;
  DataStream::DataStream(in_stack_fffffffffffff420,sp_02);
  Coin::Coin((Coin *)in_stack_fffffffffffff408);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffff418,(Coin *)in_stack_fffffffffffff410);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff418,
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [22])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    in_stack_fffffffffffff408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_8a8,local_8c8,&local_8d8,0x223,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>
                        *)in_stack_fffffffffffff408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  Coin::~Coin((Coin *)in_stack_fffffffffffff408);
  local_8e8 = 0;
  uStack_8e0 = 0;
  local_8f8 = 0;
  uStack_8f0 = 0;
  DataStream::DataStream((DataStream *)in_stack_fffffffffffff408);
  local_900 = 3000000000;
  local_908 = (unsigned_long *)
              Using<VarIntFormatter<(VarIntMode)0>,unsigned_long&>
                        ((unsigned_long *)in_stack_fffffffffffff410);
  DataStream::operator<<
            ((DataStream *)in_stack_fffffffffffff418,
             (Wrapper<VarIntFormatter<(VarIntMode)0>,_unsigned_long_&> *)in_stack_fffffffffffff410);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff448,in_stack_fffffffffffff440,(size_t)in_stack_fffffffffffff438
               ,(const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [1])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    Span<const_std::byte>::Span<DataStream>
              ((Span<const_std::byte> *)in_stack_fffffffffffff418,
               (DataStream *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
    s.m_data._7_1_ = in_stack_fffffffffffff437;
    s.m_data._0_7_ = in_stack_fffffffffffff430;
    s.m_size = (size_t)in_stack_fffffffffffff438;
    HexStr_abi_cxx11_(s);
    in_stack_fffffffffffff418 = "\"8a95c0bb00\"";
    in_stack_fffffffffffff410 = "8a95c0bb00";
    in_stack_fffffffffffff408 = "HexStr(tmp)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[11]>
              (local_948,local_958,0x22b,1,2,local_300);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffff408);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff408);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  aVar3 = util::hex_literals::
          operator___hex<util::hex_literals::detail::Hex<15UL>___0,_0,_138,_149,_192,_187,_0___>();
  this_00 = (unit_test_log_t *)CONCAT17(extraout_var,aVar3._M_elems);
  local_337 = aVar3._M_elems[6];
  local_339 = aVar3._M_elems._4_2_;
  local_33d = aVar3._M_elems._0_4_;
  Span<std::byte_const>::Span<std::array<std::byte,7ul>>
            ((Span<const_std::byte> *)in_stack_fffffffffffff418,
             (array<std::byte,_7UL> *)in_stack_fffffffffffff410,in_stack_fffffffffffff408);
  sp_03.m_data._7_1_ = in_stack_fffffffffffff437;
  sp_03.m_data._0_7_ = in_stack_fffffffffffff430;
  sp_03.m_size = (size_t)in_stack_fffffffffffff438;
  DataStream::DataStream(in_stack_fffffffffffff420,sp_03);
  Coin::Coin((Coin *)in_stack_fffffffffffff408);
  DataStream::operator>>((DataStream *)in_stack_fffffffffffff418,(Coin *)in_stack_fffffffffffff410);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff408);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)in_stack_fffffffffffff438,
               (const_string *)CONCAT17(in_stack_fffffffffffff437,in_stack_fffffffffffff430));
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff418,
               SUB81((ulong)in_stack_fffffffffffff410 >> 0x38,0));
    in_stack_fffffffffffff438 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff410,(char (*) [22])in_stack_fffffffffffff408);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff418,in_stack_fffffffffffff410,
               (unsigned_long)in_stack_fffffffffffff408);
    in_stack_fffffffffffff408 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_9d0,local_9f0,&local_a00,0x230,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[22],_const_char_(&)[22]>
                        *)in_stack_fffffffffffff408);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff408);
    in_stack_fffffffffffff437 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffff437);
  Coin::~Coin((Coin *)in_stack_fffffffffffff408);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff408);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff408);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff408);
  Coin::~Coin((Coin *)in_stack_fffffffffffff408);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff408);
  Coin::~Coin((Coin *)in_stack_fffffffffffff408);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff408);
  Coin::~Coin((Coin *)in_stack_fffffffffffff408);
  DataStream::~DataStream((DataStream *)in_stack_fffffffffffff408);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(ccoins_serialization)
{
    // Good example
    DataStream ss1{"97f23c835800816115944e077fe7c803cfa57f29b36bf87c1d35"_hex};
    Coin cc1;
    ss1 >> cc1;
    BOOST_CHECK_EQUAL(cc1.fCoinBase, false);
    BOOST_CHECK_EQUAL(cc1.nHeight, 203998U);
    BOOST_CHECK_EQUAL(cc1.out.nValue, CAmount{60000000000});
    BOOST_CHECK_EQUAL(HexStr(cc1.out.scriptPubKey), HexStr(GetScriptForDestination(PKHash(uint160("816115944e077fe7c803cfa57f29b36bf87c1d35"_hex_u8)))));

    // Good example
    DataStream ss2{"8ddf77bbd123008c988f1a4a4de2161e0f50aac7f17e7f9555caa4"_hex};
    Coin cc2;
    ss2 >> cc2;
    BOOST_CHECK_EQUAL(cc2.fCoinBase, true);
    BOOST_CHECK_EQUAL(cc2.nHeight, 120891U);
    BOOST_CHECK_EQUAL(cc2.out.nValue, 110397);
    BOOST_CHECK_EQUAL(HexStr(cc2.out.scriptPubKey), HexStr(GetScriptForDestination(PKHash(uint160("8c988f1a4a4de2161e0f50aac7f17e7f9555caa4"_hex_u8)))));

    // Smallest possible example
    DataStream ss3{"000006"_hex};
    Coin cc3;
    ss3 >> cc3;
    BOOST_CHECK_EQUAL(cc3.fCoinBase, false);
    BOOST_CHECK_EQUAL(cc3.nHeight, 0U);
    BOOST_CHECK_EQUAL(cc3.out.nValue, 0);
    BOOST_CHECK_EQUAL(cc3.out.scriptPubKey.size(), 0U);

    // scriptPubKey that ends beyond the end of the stream
    DataStream ss4{"000007"_hex};
    try {
        Coin cc4;
        ss4 >> cc4;
        BOOST_CHECK_MESSAGE(false, "We should have thrown");
    } catch (const std::ios_base::failure&) {
    }

    // Very large scriptPubKey (3*10^9 bytes) past the end of the stream
    DataStream tmp{};
    uint64_t x = 3000000000ULL;
    tmp << VARINT(x);
    BOOST_CHECK_EQUAL(HexStr(tmp), "8a95c0bb00");
    DataStream ss5{"00008a95c0bb00"_hex};
    try {
        Coin cc5;
        ss5 >> cc5;
        BOOST_CHECK_MESSAGE(false, "We should have thrown");
    } catch (const std::ios_base::failure&) {
    }
}